

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peter.c
# Opt level: O0

int main(void)

{
  int iVar1;
  GLFWwindow *local_18;
  GLFWwindow *window;
  
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  local_18 = open_window();
  if (local_18 == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glClearColor(0,0,0);
  do {
    iVar1 = glfwWindowShouldClose(local_18);
    if (iVar1 != 0) {
      glfwTerminate();
      exit(0);
    }
    glClear(0x4000);
    glfwSwapBuffers(local_18);
    glfwWaitEvents();
    if (reopen != '\0') {
      glfwDestroyWindow(local_18);
      local_18 = open_window();
      if (local_18 == (GLFWwindow *)0x0) {
        glfwTerminate();
        exit(1);
      }
      reopen = '\0';
    }
    fflush(_stdout);
  } while( true );
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = open_window();
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glClearColor(0.f, 0.f, 0.f, 0.f);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        glfwSwapBuffers(window);
        glfwWaitEvents();

        if (reopen)
        {
            glfwDestroyWindow(window);
            window = open_window();
            if (!window)
            {
                glfwTerminate();
                exit(EXIT_FAILURE);
            }

            reopen = GL_FALSE;
        }

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}